

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O1

void rw::writeBMP(Image *image,char *filename)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  byte val;
  void *__buf;
  int iVar7;
  Error *data;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  StreamFile file;
  BMPheader bmp;
  DIBheader dib;
  StreamFile local_88;
  BMPheader local_78;
  Error local_68;
  int32 local_60;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  local_88.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148c68;
  local_88.file = (void *)0x0;
  iVar2 = StreamFile::open(&local_88,filename,0x134d3a);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_68.plugin = 0;
    local_68.code = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/bmp.cpp",0xcb);
    __stream = _stderr;
    pcVar6 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar6);
    setError(&local_68);
  }
  else {
    iVar2 = image->depth;
    iVar5 = 0x100;
    if (iVar2 == 4) {
      iVar5 = 0x10;
    }
    iVar7 = 0;
    if (iVar2 < 9) {
      iVar7 = iVar5;
    }
    iVar3 = image->width * iVar2;
    iVar5 = iVar3 + 7;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    local_78.magic = 0x4d42;
    local_78.offset = iVar7 * 4 + 0x36;
    local_78.size = ((iVar5 >> 3) + 3U & 0xfffffffc) * image->height + iVar7 * 4 + 0x36;
    local_78.reserved[0] = 0;
    local_78.reserved[1] = 0;
    BMPheader::write(&local_78,(int)&local_88,__buf,(ulong)local_78.size);
    iVar5 = 0x18;
    if (iVar2 != 0x20) {
      iVar5 = iVar2;
    }
    data = &local_68;
    local_68.code = image->width;
    local_68.plugin = 0x28;
    local_60 = image->height;
    local_5c = 1;
    local_5a = (undefined2)iVar5;
    local_58 = 0;
    uStack_50 = 0xb1300000b13;
    local_48 = 0;
    StreamFile::write8(&local_88,data,0x28);
    if (iVar2 < 9) {
      uVar8 = 0;
      do {
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar8 * 4 + 2]);
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar8 * 4 + 1]);
        Stream::writeU8(&local_88.super_Stream,image->palette[uVar8 * 4]);
        data = (Error *)0xff;
        Stream::writeU8(&local_88.super_Stream,0xff);
        uVar8 = uVar8 + 1;
      } while (iVar7 + (uint)(iVar7 == 0) != uVar8);
    }
    iVar2 = (int)data;
    if (0 < image->height) {
      pbVar10 = image->pixels + (long)image->stride * ((long)image->height + -1);
      iVar5 = 0;
      do {
        pbVar9 = pbVar10;
        if (0 < image->width) {
          iVar2 = 0;
          do {
            switch(image->depth << 0x1e | image->depth - 4U >> 2) {
            case 0:
              val = pbVar9[1] & 0xf | *pbVar9 << 4;
              data = (Error *)(ulong)val;
              Stream::writeU8(&local_88.super_Stream,val);
              pbVar9 = pbVar9 + 2;
              iVar2 = iVar2 + 1;
              break;
            case 1:
              data = (Error *)(ulong)*pbVar9;
              Stream::writeU8(&local_88.super_Stream,*pbVar9);
              pbVar9 = pbVar9 + 1;
              break;
            case 3:
              Stream::writeU8(&local_88.super_Stream,*pbVar9);
              data = (Error *)(ulong)pbVar9[1];
              Stream::writeU8(&local_88.super_Stream,pbVar9[1]);
              pbVar9 = pbVar9 + 2;
              break;
            case 5:
              Stream::writeU8(&local_88.super_Stream,pbVar9[2]);
              Stream::writeU8(&local_88.super_Stream,pbVar9[1]);
              data = (Error *)(ulong)*pbVar9;
              Stream::writeU8(&local_88.super_Stream,*pbVar9);
              pbVar9 = pbVar9 + 3;
              break;
            case 7:
              Stream::writeU8(&local_88.super_Stream,pbVar9[2]);
              Stream::writeU8(&local_88.super_Stream,pbVar9[1]);
              data = (Error *)(ulong)*pbVar9;
              Stream::writeU8(&local_88.super_Stream,*pbVar9);
              pbVar9 = pbVar9 + 4;
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < image->width);
        }
        uVar1 = (uint)((long)pbVar9 - (long)pbVar10);
        uVar4 = uVar1 + 3;
        if (-1 < (long)pbVar9 - (long)pbVar10) {
          uVar4 = uVar1;
        }
        iVar7 = (uVar1 - (uVar4 & 0xfffffffc)) + 1;
        while( true ) {
          iVar2 = (int)data;
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) break;
          data = (Error *)0x0;
          Stream::writeU8(&local_88.super_Stream,'\0');
        }
        pbVar10 = pbVar10 + -(long)image->stride;
        iVar5 = iVar5 + 1;
      } while (iVar5 < image->height);
    }
    StreamFile::close(&local_88,iVar2);
  }
  return;
}

Assistant:

void
writeBMP(Image *image, const char *filename)
{
	ASSERTLITTLE;
	uint8 *p;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	int32 pallen = image->depth > 8  ? 0 :
	               image->depth == 4 ? 16 : 256;
	int32 stride = image->width*image->depth/8;
	int32 depth = image->depth == 32 ? 24 : image->depth;
	stride = stride+3 & ~3;

	// File headers
	BMPheader bmp;
	bmp.magic = 0x4D42;	// BM
	bmp.size = 0x36 + 4*pallen + image->height*stride;
	bmp.reserved[0] = 0;
	bmp.reserved[1] = 0;
	bmp.offset = 0x36 + 4*pallen;
	bmp.write(&file);

	DIBheader dib;
	dib.headerSize = 0x28;
	dib.width = image->width;
	dib.height = image->height;
	dib.numPlanes = 1;
	dib.depth = depth;
	dib.compression = 0;
	dib.imgSize = 0;
	dib.hres = 2835;	// 72dpi
	dib.vres = 2835;	// 72dpi
	dib.paletteLen = 0;
	dib.numImportant = 0;
	file.write8(&dib, dib.headerSize);

	for(int i = 0; i < pallen; i++){
		file.writeU8(image->palette[i*4+2]);
		file.writeU8(image->palette[i*4+1]);
		file.writeU8(image->palette[i*4+0]);
		file.writeU8(0xFF);
	}

	uint8 *line = image->pixels + (image->height-1)*image->stride;
	int32 n;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
				file.writeU8((p[0]&0xF)<<4 | (p[1]&0xF));
				p += 2;
				x++;
				break;
			case 8:
				file.writeU8(*p++);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				p += 2;
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 3;
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 4;
			}
		}
		n = (p-line) % 4;
		while(n--)
			file.writeU8(0);
		line -= image->stride;
	}

	file.close();
}